

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GridAxisRegular::operator==(GridAxisRegular *this,GridAxisRegular *Value)

{
  GridAxisRegular *Value_local;
  GridAxisRegular *this_local;
  
  if (((double)this->m_f64DomainInitialXi != (double)Value->m_f64DomainInitialXi) ||
     (NAN((double)this->m_f64DomainInitialXi) || NAN((double)Value->m_f64DomainInitialXi))) {
    this_local._7_1_ = false;
  }
  else if (((double)this->m_f64DomainFinalXi != (double)Value->m_f64DomainFinalXi) ||
          (NAN((double)this->m_f64DomainFinalXi) || NAN((double)Value->m_f64DomainFinalXi))) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui16DomainPointsXi == Value->m_ui16DomainPointsXi) {
    if (this->m_ui8InterleafFactor == Value->m_ui8InterleafFactor) {
      if (this->m_ui8AxisType == Value->m_ui8AxisType) {
        if (this->m_ui16NumPoints == Value->m_ui16NumPoints) {
          if (this->m_ui16InitialIndex == Value->m_ui16InitialIndex) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GridAxisRegular::operator == ( const GridAxisRegular & Value ) const
{
    if( m_f64DomainInitialXi != Value.m_f64DomainInitialXi ) return false;
    if( m_f64DomainFinalXi   != Value.m_f64DomainFinalXi )   return false;
    if( m_ui16DomainPointsXi != Value.m_ui16DomainPointsXi ) return false;
    if( m_ui8InterleafFactor != Value.m_ui8InterleafFactor ) return false;
    if( m_ui8AxisType        != Value.m_ui8AxisType )        return false;
    if( m_ui16NumPoints      != Value.m_ui16NumPoints )      return false;
    if( m_ui16InitialIndex   != Value.m_ui16InitialIndex )   return false;
    return true;
}